

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_transporter.cpp
# Opt level: O1

bool __thiscall
SocketClientTransporter::Connect(SocketClientTransporter *this,string *host,int port,string *err)

{
  char *pcVar1;
  bool bVar2;
  int err_00;
  char *pcVar3;
  unique_lock<std::mutex> lock;
  sockaddr_storage addr;
  unique_lock<std::mutex> local_b8;
  sockaddr_storage local_a8;
  
  (this->uvClient).data = this;
  uv_tcp_init((this->super_Transporter).loop,&this->uvClient);
  bVar2 = Transporter::ParseSocketAddress(host,port,&local_a8,err);
  if (bVar2) {
    (this->connect_req).data = this;
    err_00 = uv_tcp_connect(&this->connect_req,&this->uvClient,(sockaddr *)&local_a8,OnConnectCB);
    if (err_00 == 0) {
      Transporter::StartEventLoop(&this->super_Transporter);
      local_b8._M_device = &this->mutex;
      local_b8._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_b8);
      local_b8._M_owns = true;
      std::condition_variable::wait((unique_lock *)&this->cv);
      if (this->connectionStatus < 0) {
        pcVar3 = uv_strerror(this->connectionStatus);
        pcVar1 = (char *)err->_M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar3);
      }
      bVar2 = Transporter::IsConnected(&this->super_Transporter);
      std::unique_lock<std::mutex>::~unique_lock(&local_b8);
    }
    else {
      pcVar3 = uv_strerror(err_00);
      pcVar1 = (char *)err->_M_string_length;
      strlen(pcVar3);
      bVar2 = false;
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar3);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SocketClientTransporter::Connect(const std::string& host, int port, std::string& err) {
	uvClient.data = this;
	uv_tcp_init(loop, &uvClient);
	struct sockaddr_storage addr;
	bool addr_suc = ParseSocketAddress(host, port, &addr, err);
	if (!addr_suc) {
		return false;
	}

	connect_req.data = this;
	const int r = uv_tcp_connect(&connect_req, &uvClient, reinterpret_cast<const struct sockaddr*>(&addr), OnConnectCB);
	if (r) {
		err = uv_strerror(r);
		return false;
	}
	StartEventLoop();
	std::unique_lock<std::mutex> lock(mutex);
	cv.wait(lock);
	if (this->connectionStatus < 0) {
		err = uv_strerror(this->connectionStatus);
	}
	return IsConnected();
}